

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void generateWithRecursiveQuery(Parse *pParse,Select *p,SelectDest *pDest)

{
  int iOffset;
  SrcList *pSVar1;
  Vdbe *p_00;
  Select *p_01;
  Expr *pEVar2;
  ExprList *pEVar3;
  int iVar4;
  int iBreak;
  int p2;
  int iVar5;
  int iVar6;
  KeyInfo *zP4;
  KeyInfo *pKeyInfo;
  int regOffset;
  int regLimit;
  Expr *pLimit;
  ExprList *pOrderBy;
  int rc;
  int i;
  SelectDest destQueue;
  int eDest;
  int iDistinct;
  int iQueue;
  int regCurrent;
  int iCurrent;
  int addrBreak;
  int addrCont;
  int addrTop;
  Select *pSetup;
  Vdbe *v;
  int nCol;
  SrcList *pSrc;
  SelectDest *pDest_local;
  Select *p_local;
  Parse *pParse_local;
  
  pSVar1 = p->pSrc;
  iVar5 = p->pEList->nExpr;
  p_00 = pParse->pVdbe;
  p_01 = p->pPrior;
  iQueue = 0;
  destQueue.pOrderBy._4_4_ = 0;
  destQueue.pOrderBy._0_4_ = 5;
  if (p->pWin == (Window *)0x0) {
    iVar4 = sqlite3AuthCheck(pParse,0x21,(char *)0x0,(char *)0x0,(char *)0x0);
    if (iVar4 == 0) {
      iBreak = sqlite3VdbeMakeLabel(pParse);
      p->nSelectRow = 0x140;
      computeLimitRegisters(pParse,p,iBreak);
      pEVar2 = p->pLimit;
      iVar4 = p->iLimit;
      iOffset = p->iOffset;
      p->pLimit = (Expr *)0x0;
      p->iOffset = 0;
      p->iLimit = 0;
      pEVar3 = p->pOrderBy;
      for (pOrderBy._4_4_ = 0; pOrderBy._4_4_ < pSVar1->nSrc; pOrderBy._4_4_ = pOrderBy._4_4_ + 1) {
        if (((byte)pSVar1->a[pOrderBy._4_4_].fg.field_0x1 >> 5 & 1) != 0) {
          iQueue = pSVar1->a[pOrderBy._4_4_].iCursor;
          break;
        }
      }
      iVar6 = pParse->nTab;
      pParse->nTab = iVar6 + 1;
      if (p->op == '\x7f') {
        destQueue.pOrderBy._0_4_ = 6;
        if (pEVar3 != (ExprList *)0x0) {
          destQueue.pOrderBy._0_4_ = 8;
        }
        destQueue.pOrderBy._4_4_ = pParse->nTab;
        pParse->nTab = destQueue.pOrderBy._4_4_ + 1;
      }
      else {
        destQueue.pOrderBy._0_4_ = 5;
        if (pEVar3 != (ExprList *)0x0) {
          destQueue.pOrderBy._0_4_ = 7;
        }
      }
      sqlite3SelectDestInit((SelectDest *)&rc,(int)destQueue.pOrderBy,iVar6);
      p2 = pParse->nMem + 1;
      pParse->nMem = p2;
      sqlite3VdbeAddOp3(p_00,0x74,iQueue,p2,iVar5);
      if (pEVar3 == (ExprList *)0x0) {
        sqlite3VdbeAddOp2(p_00,0x71,iVar6,iVar5);
      }
      else {
        zP4 = multiSelectOrderByKeyInfo(pParse,p,1);
        sqlite3VdbeAddOp4(p_00,0x71,iVar6,pEVar3->nExpr + 2,0,(char *)zP4,-9);
        destQueue.zAffSdst = (char *)pEVar3;
      }
      if (destQueue.pOrderBy._4_4_ != 0) {
        iVar5 = sqlite3VdbeAddOp2(p_00,0x71,destQueue.pOrderBy._4_4_,0);
        p->addrOpenEphm[0] = iVar5;
        p->selFlags = p->selFlags | 0x20;
      }
      p->pOrderBy = (ExprList *)0x0;
      p_01->pNext = (Select *)0x0;
      sqlite3VdbeExplain(pParse,'\x01',"SETUP");
      iVar5 = sqlite3Select(pParse,p_01,(SelectDest *)&rc);
      p_01->pNext = p;
      if (iVar5 == 0) {
        iVar5 = sqlite3VdbeAddOp2(p_00,0x24,iVar6,iBreak);
        sqlite3VdbeAddOp1(p_00,0x81,iQueue);
        if (pEVar3 == (ExprList *)0x0) {
          sqlite3VdbeAddOp2(p_00,0x7f,iVar6,p2);
        }
        else {
          sqlite3VdbeAddOp3(p_00,0x5a,iVar6,pEVar3->nExpr + 1,p2);
        }
        sqlite3VdbeAddOp1(p_00,0x7b,iVar6);
        iVar6 = sqlite3VdbeMakeLabel(pParse);
        codeOffset(p_00,iOffset,iVar6);
        selectInnerLoop(pParse,p,iQueue,(SortCtx *)0x0,(DistinctCtx *)0x0,pDest,iVar6,iBreak);
        if (iVar4 != 0) {
          sqlite3VdbeAddOp2(p_00,0x31,iVar4,iBreak);
        }
        sqlite3VdbeResolveLabel(p_00,iVar6);
        if ((p->selFlags & 8) == 0) {
          p->pPrior = (Select *)0x0;
          sqlite3VdbeExplain(pParse,'\x01',"RECURSIVE STEP");
          sqlite3Select(pParse,p,(SelectDest *)&rc);
          p->pPrior = p_01;
        }
        else {
          sqlite3ErrorMsg(pParse,"recursive aggregate queries not supported");
        }
        sqlite3VdbeGoto(p_00,iVar5);
        sqlite3VdbeResolveLabel(p_00,iBreak);
      }
      sqlite3ExprListDelete(pParse->db,p->pOrderBy);
      p->pOrderBy = pEVar3;
      p->pLimit = pEVar2;
    }
  }
  else {
    sqlite3ErrorMsg(pParse,"cannot use window functions in recursive queries");
  }
  return;
}

Assistant:

static void generateWithRecursiveQuery(
  Parse *pParse,        /* Parsing context */
  Select *p,            /* The recursive SELECT to be coded */
  SelectDest *pDest     /* What to do with query results */
){
  SrcList *pSrc = p->pSrc;      /* The FROM clause of the recursive query */
  int nCol = p->pEList->nExpr;  /* Number of columns in the recursive table */
  Vdbe *v = pParse->pVdbe;      /* The prepared statement under construction */
  Select *pSetup = p->pPrior;   /* The setup query */
  int addrTop;                  /* Top of the loop */
  int addrCont, addrBreak;      /* CONTINUE and BREAK addresses */
  int iCurrent = 0;             /* The Current table */
  int regCurrent;               /* Register holding Current table */
  int iQueue;                   /* The Queue table */
  int iDistinct = 0;            /* To ensure unique results if UNION */
  int eDest = SRT_Fifo;         /* How to write to Queue */
  SelectDest destQueue;         /* SelectDest targetting the Queue table */
  int i;                        /* Loop counter */
  int rc;                       /* Result code */
  ExprList *pOrderBy;           /* The ORDER BY clause */
  Expr *pLimit;                 /* Saved LIMIT and OFFSET */
  int regLimit, regOffset;      /* Registers used by LIMIT and OFFSET */

#ifndef SQLITE_OMIT_WINDOWFUNC
  if( p->pWin ){
    sqlite3ErrorMsg(pParse, "cannot use window functions in recursive queries");
    return;
  }
#endif

  /* Obtain authorization to do a recursive query */
  if( sqlite3AuthCheck(pParse, SQLITE_RECURSIVE, 0, 0, 0) ) return;

  /* Process the LIMIT and OFFSET clauses, if they exist */
  addrBreak = sqlite3VdbeMakeLabel(pParse);
  p->nSelectRow = 320;  /* 4 billion rows */
  computeLimitRegisters(pParse, p, addrBreak);
  pLimit = p->pLimit;
  regLimit = p->iLimit;
  regOffset = p->iOffset;
  p->pLimit = 0;
  p->iLimit = p->iOffset = 0;
  pOrderBy = p->pOrderBy;

  /* Locate the cursor number of the Current table */
  for(i=0; ALWAYS(i<pSrc->nSrc); i++){
    if( pSrc->a[i].fg.isRecursive ){
      iCurrent = pSrc->a[i].iCursor;
      break;
    }
  }

  /* Allocate cursors numbers for Queue and Distinct.  The cursor number for
  ** the Distinct table must be exactly one greater than Queue in order
  ** for the SRT_DistFifo and SRT_DistQueue destinations to work. */
  iQueue = pParse->nTab++;
  if( p->op==TK_UNION ){
    eDest = pOrderBy ? SRT_DistQueue : SRT_DistFifo;
    iDistinct = pParse->nTab++;
  }else{
    eDest = pOrderBy ? SRT_Queue : SRT_Fifo;
  }
  sqlite3SelectDestInit(&destQueue, eDest, iQueue);

  /* Allocate cursors for Current, Queue, and Distinct. */
  regCurrent = ++pParse->nMem;
  sqlite3VdbeAddOp3(v, OP_OpenPseudo, iCurrent, regCurrent, nCol);
  if( pOrderBy ){
    KeyInfo *pKeyInfo = multiSelectOrderByKeyInfo(pParse, p, 1);
    sqlite3VdbeAddOp4(v, OP_OpenEphemeral, iQueue, pOrderBy->nExpr+2, 0,
                      (char*)pKeyInfo, P4_KEYINFO);
    destQueue.pOrderBy = pOrderBy;
  }else{
    sqlite3VdbeAddOp2(v, OP_OpenEphemeral, iQueue, nCol);
  }
  VdbeComment((v, "Queue table"));
  if( iDistinct ){
    p->addrOpenEphm[0] = sqlite3VdbeAddOp2(v, OP_OpenEphemeral, iDistinct, 0);
    p->selFlags |= SF_UsesEphemeral;
  }

  /* Detach the ORDER BY clause from the compound SELECT */
  p->pOrderBy = 0;

  /* Store the results of the setup-query in Queue. */
  pSetup->pNext = 0;
  ExplainQueryPlan((pParse, 1, "SETUP"));
  rc = sqlite3Select(pParse, pSetup, &destQueue);
  pSetup->pNext = p;
  if( rc ) goto end_of_recursive_query;

  /* Find the next row in the Queue and output that row */
  addrTop = sqlite3VdbeAddOp2(v, OP_Rewind, iQueue, addrBreak); VdbeCoverage(v);

  /* Transfer the next row in Queue over to Current */
  sqlite3VdbeAddOp1(v, OP_NullRow, iCurrent); /* To reset column cache */
  if( pOrderBy ){
    sqlite3VdbeAddOp3(v, OP_Column, iQueue, pOrderBy->nExpr+1, regCurrent);
  }else{
    sqlite3VdbeAddOp2(v, OP_RowData, iQueue, regCurrent);
  }
  sqlite3VdbeAddOp1(v, OP_Delete, iQueue);

  /* Output the single row in Current */
  addrCont = sqlite3VdbeMakeLabel(pParse);
  codeOffset(v, regOffset, addrCont);
  selectInnerLoop(pParse, p, iCurrent,
      0, 0, pDest, addrCont, addrBreak);
  if( regLimit ){
    sqlite3VdbeAddOp2(v, OP_DecrJumpZero, regLimit, addrBreak);
    VdbeCoverage(v);
  }
  sqlite3VdbeResolveLabel(v, addrCont);

  /* Execute the recursive SELECT taking the single row in Current as
  ** the value for the recursive-table. Store the results in the Queue.
  */
  if( p->selFlags & SF_Aggregate ){
    sqlite3ErrorMsg(pParse, "recursive aggregate queries not supported");
  }else{
    p->pPrior = 0;
    ExplainQueryPlan((pParse, 1, "RECURSIVE STEP"));
    sqlite3Select(pParse, p, &destQueue);
    assert( p->pPrior==0 );
    p->pPrior = pSetup;
  }

  /* Keep running the loop until the Queue is empty */
  sqlite3VdbeGoto(v, addrTop);
  sqlite3VdbeResolveLabel(v, addrBreak);

end_of_recursive_query:
  sqlite3ExprListDelete(pParse->db, p->pOrderBy);
  p->pOrderBy = pOrderBy;
  p->pLimit = pLimit;
  return;
}